

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::Tokenizer(Tokenizer *this)

{
  Tokenizer *this_local;
  
  this->allow_eof = false;
  this->include_ignorable = false;
  std::__cxx11::string::string((string *)&this->val);
  std::__cxx11::string::string((string *)&this->raw_val);
  std::__cxx11::string::string((string *)&this->error_message);
  reset(this);
  return;
}

Assistant:

Tokenizer::Tokenizer()
{
    reset();
}